

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.h
# Opt level: O1

vector3 * vector3::aleatorioEmEsferaUnitaria(void)

{
  int iVar1;
  vector3 *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  
  do {
    iVar1 = rand();
    dVar4 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
    iVar1 = rand();
    dVar2 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
    iVar1 = rand();
    dVar3 = (double)iVar1 * 4.656612873077393e-10 + (double)iVar1 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2);
  in_RDI->e[1] = dVar2;
  in_RDI->e[2] = dVar3;
  in_RDI->e[0] = dVar4;
  return in_RDI;
}

Assistant:

static const vector3 aleatorioEmEsferaUnitaria() {
        while(true) {
            vector3 ponto = vector3::aleatorio(-1, 1);
            if (ponto.quadradoComprimento() >= 1) continue;
            return ponto;
        }
    }